

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool Catch::startsWith(string *s,string *prefix)

{
  int iVar1;
  bool bVar2;
  undefined1 *local_38;
  size_t local_30;
  undefined1 local_28 [16];
  
  if (s->_M_string_length < prefix->_M_string_length) {
    bVar2 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_38,(ulong)s);
    if (local_30 == prefix->_M_string_length) {
      if (local_30 == 0) {
        bVar2 = true;
      }
      else {
        iVar1 = bcmp(local_38,(prefix->_M_dataplus)._M_p,local_30);
        bVar2 = iVar1 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
  }
  return bVar2;
}

Assistant:

bool startsWith(std::string const& s, std::string const& prefix) {
		return s.size() >= prefix.size() && s.substr(0, prefix.size()) == prefix;
	}